

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

void phosg::readx(int fd,void *data,size_t size)

{
  size_t sVar1;
  io_error *piVar2;
  string local_40;
  
  sVar1 = ::read(fd,data,size);
  if ((long)sVar1 < 0) {
    piVar2 = (io_error *)__cxa_allocate_exception(0x20);
    io_error::io_error(piVar2,fd);
    __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
  }
  if (sVar1 == size) {
    return;
  }
  piVar2 = (io_error *)__cxa_allocate_exception(0x20);
  string_printf_abi_cxx11_(&local_40,"expected %zu bytes, read %zd bytes",size,sVar1);
  io_error::io_error(piVar2,fd,(string *)&local_40);
  __cxa_throw(piVar2,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

void readx(int fd, void* data, size_t size) {
  ssize_t ret_size = ::read(fd, data, size);
  if (ret_size < 0) {
    throw io_error(fd);
  } else if (ret_size != static_cast<ssize_t>(size)) {
    throw io_error(fd, string_printf("expected %zu bytes, read %zd bytes", size, ret_size));
  }
}